

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O3

yajl_gen yajl_gen_alloc(yajl_alloc_funcs *afs)

{
  yajl_realloc_func p_Var1;
  yajl_free_func p_Var2;
  void *pvVar3;
  yajl_gen __s;
  yajl_buf pyVar4;
  yajl_alloc_funcs afsBuffer;
  yajl_alloc_funcs local_30;
  
  if (afs == (yajl_alloc_funcs *)0x0) {
    afs = &local_30;
    yajl_set_default_alloc_funcs(afs);
  }
  else {
    local_30.malloc = afs->malloc;
    if (local_30.malloc == (yajl_malloc_func)0x0) {
      return (yajl_gen)0x0;
    }
    if (afs->realloc == (yajl_realloc_func)0x0) {
      return (yajl_gen)0x0;
    }
    if (afs->free == (yajl_free_func)0x0) {
      return (yajl_gen)0x0;
    }
  }
  __s = (yajl_gen)(*local_30.malloc)(afs->ctx,0x240);
  if (__s == (yajl_gen)0x0) {
    return (yajl_gen)0x0;
  }
  memset(__s,0,0x240);
  p_Var1 = afs->realloc;
  p_Var2 = afs->free;
  pvVar3 = afs->ctx;
  (__s->alloc).malloc = afs->malloc;
  (__s->alloc).realloc = p_Var1;
  (__s->alloc).free = p_Var2;
  (__s->alloc).ctx = pvVar3;
  __s->print = yajl_buf_append;
  pyVar4 = yajl_buf_alloc(&__s->alloc);
  __s->ctx = pyVar4;
  __s->indentString = "    ";
  return __s;
}

Assistant:

yajl_gen
yajl_gen_alloc(const yajl_alloc_funcs * afs)
{
    yajl_gen g = NULL;
    yajl_alloc_funcs afsBuffer;

    /* first order of business is to set up memory allocation routines */
    if (afs != NULL) {
        if (afs->malloc == NULL || afs->realloc == NULL || afs->free == NULL)
        {
            return NULL;
        }
    } else {
        yajl_set_default_alloc_funcs(&afsBuffer);
        afs = &afsBuffer;
    }

    g = (yajl_gen) YA_MALLOC(afs, sizeof(struct yajl_gen_t));
    if (!g) return NULL;

    memset((void *) g, 0, sizeof(struct yajl_gen_t));
    /* copy in pointers to allocation routines */
    memcpy((void *) &(g->alloc), (const void *) afs, sizeof(yajl_alloc_funcs));

    g->print = (yajl_print_t)&yajl_buf_append;
    g->ctx = yajl_buf_alloc(&(g->alloc));
    g->indentString = "    ";

    return g;
}